

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::TryCompile
          (cmMakefile *this,string *srcdir,string *bindir,string *projectName,string *targetName,
          bool fast,int jobs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmakeArgs,string *output)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  cmGlobalGenerator *pcVar4;
  string *psVar5;
  char *pcVar6;
  cmGlobalGenerator *gen;
  allocator<char> local_6e1;
  int ret;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  allocator<char> local_641;
  string local_640;
  allocator<char> local_619;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  char *local_5d0;
  char *recursionDepth;
  string local_5c0;
  allocator<char> local_599;
  string local_598;
  char *local_578;
  char *config;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string local_498;
  cmGlobalGenerator *local_478;
  cmGlobalGenerator *gg;
  cmake cm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_70 [8];
  cmWorkingDirectory workdir;
  bool fast_local;
  string *targetName_local;
  string *projectName_local;
  string *bindir_local;
  string *srcdir_local;
  cmMakefile *this_local;
  
  this->IsSourceFileTryCompile = fast;
  workdir._39_1_ = fast;
  bVar1 = cmsys::SystemTools::FileIsDirectory(bindir);
  if (!bVar1) {
    cmsys::SystemTools::MakeDirectory(bindir,(mode_t *)0x0);
  }
  cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_70,bindir);
  bVar1 = cmWorkingDirectory::Failed((cmWorkingDirectory *)local_70);
  if (bVar1) {
    std::operator+(&local_e0,"Failed to set working directory to ",bindir);
    std::operator+(&local_c0,&local_e0," : ");
    iVar3 = cmWorkingDirectory::GetLastResult((cmWorkingDirectory *)local_70);
    pcVar6 = strerror(iVar3);
    std::operator+(&local_a0,&local_c0,pcVar6);
    IssueMessage(this,FATAL_ERROR,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    this_local._4_4_ = 1;
    cm._900_4_ = 1;
  }
  else {
    cmake::cmake((cmake *)&gg,RoleProject,Project);
    cmake::SetIsInTryCompile((cmake *)&gg,true);
    pcVar4 = GetGlobalGenerator(this);
    (*pcVar4->_vptr_cmGlobalGenerator[3])(&local_498);
    pcVar4 = cmake::CreateGlobalGenerator((cmake *)&gg,&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    local_478 = pcVar4;
    if (pcVar4 == (cmGlobalGenerator *)0x0) {
      pcVar4 = GetGlobalGenerator(this);
      (*pcVar4->_vptr_cmGlobalGenerator[3])(&local_4f8);
      std::operator+(&local_4d8,"Global generator \'",&local_4f8);
      std::operator+(&local_4b8,&local_4d8,"\' could not be created.");
      IssueMessage(this,INTERNAL_ERROR,&local_4b8);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::__cxx11::string::~string((string *)&local_4f8);
      cmSystemTools::SetFatalErrorOccured();
      this->IsSourceFileTryCompile = false;
      this_local._4_4_ = 1;
    }
    else {
      pcVar4->RecursionDepth = this->RecursionDepth;
      cmake::SetGlobalGenerator((cmake *)&gg,pcVar4);
      cmake::SetHomeDirectory((cmake *)&gg,srcdir);
      cmake::SetHomeOutputDirectory((cmake *)&gg,bindir);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_518,"CMAKE_GENERATOR_INSTANCE",&local_519);
      psVar5 = GetSafeDefinition(this,&local_518);
      cmake::SetGeneratorInstance((cmake *)&gg,psVar5);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_540,"CMAKE_GENERATOR_PLATFORM",&local_541);
      psVar5 = GetSafeDefinition(this,&local_540);
      cmake::SetGeneratorPlatform((cmake *)&gg,psVar5);
      std::__cxx11::string::~string((string *)&local_540);
      std::allocator<char>::~allocator(&local_541);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_568,"CMAKE_GENERATOR_TOOLSET",
                 (allocator<char> *)((long)&config + 7));
      psVar5 = GetSafeDefinition(this,&local_568);
      cmake::SetGeneratorToolset((cmake *)&gg,psVar5);
      std::__cxx11::string::~string((string *)&local_568);
      std::allocator<char>::~allocator((allocator<char> *)((long)&config + 7));
      cmake::LoadCache((cmake *)&gg);
      uVar2 = (*local_478->_vptr_cmGlobalGenerator[0x23])();
      if ((uVar2 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_598,"CMAKE_TRY_COMPILE_CONFIGURATION",&local_599);
        pcVar6 = GetDefinition(this,&local_598);
        std::__cxx11::string::~string((string *)&local_598);
        std::allocator<char>::~allocator(&local_599);
        local_578 = pcVar6;
        if (pcVar6 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_5c0,"CMAKE_BUILD_TYPE",
                     (allocator<char> *)((long)&recursionDepth + 7));
          cmake::AddCacheEntry((cmake *)&gg,&local_5c0,local_578,"Build configuration",3);
          std::__cxx11::string::~string((string *)&local_5c0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&recursionDepth + 7));
        }
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f0,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_5f1);
      pcVar6 = GetDefinition(this,&local_5f0);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::allocator<char>::~allocator(&local_5f1);
      local_5d0 = pcVar6;
      if (pcVar6 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_618,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_619);
        cmake::AddCacheEntry((cmake *)&gg,&local_618,local_5d0,"Maximum recursion depth",3);
        std::__cxx11::string::~string((string *)&local_618);
        std::allocator<char>::~allocator(&local_619);
      }
      if (cmakeArgs !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        cmake::SetWarnUnusedCli((cmake *)&gg,false);
        cmake::SetCacheArgs((cmake *)&gg,cmakeArgs);
      }
      pcVar4 = local_478;
      gen = GetGlobalGenerator(this);
      cmGlobalGenerator::EnableLanguagesFromGenerator(pcVar4,gen,this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_640,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_641);
      bVar1 = IsOn(this,&local_640);
      std::__cxx11::string::~string((string *)&local_640);
      std::allocator<char>::~allocator(&local_641);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_668,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_669);
        cmake::AddCacheEntry((cmake *)&gg,&local_668,"TRUE","",4);
        std::__cxx11::string::~string((string *)&local_668);
        std::allocator<char>::~allocator(&local_669);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_690,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_691);
        cmake::AddCacheEntry((cmake *)&gg,&local_690,"FALSE","",4);
        std::__cxx11::string::~string((string *)&local_690);
        std::allocator<char>::~allocator(&local_691);
      }
      iVar3 = cmake::Configure((cmake *)&gg);
      if (iVar3 == 0) {
        iVar3 = cmake::Generate((cmake *)&gg);
        if (iVar3 == 0) {
          pcVar4 = GetGlobalGenerator(this);
          this_local._4_4_ =
               cmGlobalGenerator::TryCompile
                         (pcVar4,jobs,srcdir,bindir,projectName,targetName,
                          (bool)(workdir._39_1_ & 1),output,this);
          this->IsSourceFileTryCompile = false;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&ret,"Failed to generate test project build system.",&local_6e1);
          IssueMessage(this,FATAL_ERROR,(string *)&ret);
          std::__cxx11::string::~string((string *)&ret);
          std::allocator<char>::~allocator(&local_6e1);
          cmSystemTools::SetFatalErrorOccured();
          this->IsSourceFileTryCompile = false;
          this_local._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6b8,"Failed to configure test project build system.",&local_6b9)
        ;
        IssueMessage(this,FATAL_ERROR,&local_6b8);
        std::__cxx11::string::~string((string *)&local_6b8);
        std::allocator<char>::~allocator(&local_6b9);
        cmSystemTools::SetFatalErrorOccured();
        this->IsSourceFileTryCompile = false;
        this_local._4_4_ = 1;
      }
    }
    cm._900_4_ = 1;
    cmake::~cmake((cmake *)&gg);
  }
  cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_70);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::TryCompile(const std::string& srcdir,
                           const std::string& bindir,
                           const std::string& projectName,
                           const std::string& targetName, bool fast, int jobs,
                           const std::vector<std::string>* cmakeArgs,
                           std::string& output)
{
  this->IsSourceFileTryCompile = fast;
  // does the binary directory exist ? If not create it...
  if (!cmSystemTools::FileIsDirectory(bindir)) {
    cmSystemTools::MakeDirectory(bindir);
  }

  // change to the tests directory and run cmake
  // use the cmake object instead of calling cmake
  cmWorkingDirectory workdir(bindir);
  if (workdir.Failed()) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to set working directory to " + bindir + " : " +
                         std::strerror(workdir.GetLastResult()));
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // make sure the same generator is used
  // use this program as the cmake to be run, it should not
  // be run that way but the cmake object requires a vailid path
  cmake cm(cmake::RoleProject, cmState::Project);
  cm.SetIsInTryCompile(true);
  cmGlobalGenerator* gg =
    cm.CreateGlobalGenerator(this->GetGlobalGenerator()->GetName());
  if (!gg) {
    this->IssueMessage(MessageType::INTERNAL_ERROR,
                       "Global generator '" +
                         this->GetGlobalGenerator()->GetName() +
                         "' could not be created.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }
  gg->RecursionDepth = this->RecursionDepth;
  cm.SetGlobalGenerator(gg);

  // do a configure
  cm.SetHomeDirectory(srcdir);
  cm.SetHomeOutputDirectory(bindir);
  cm.SetGeneratorInstance(this->GetSafeDefinition("CMAKE_GENERATOR_INSTANCE"));
  cm.SetGeneratorPlatform(this->GetSafeDefinition("CMAKE_GENERATOR_PLATFORM"));
  cm.SetGeneratorToolset(this->GetSafeDefinition("CMAKE_GENERATOR_TOOLSET"));
  cm.LoadCache();
  if (!gg->IsMultiConfig()) {
    if (const char* config =
          this->GetDefinition("CMAKE_TRY_COMPILE_CONFIGURATION")) {
      // Tell the single-configuration generator which one to use.
      // Add this before the user-provided CMake arguments in case
      // one of the arguments is -DCMAKE_BUILD_TYPE=...
      cm.AddCacheEntry("CMAKE_BUILD_TYPE", config, "Build configuration",
                       cmStateEnums::STRING);
    }
  }
  const char* recursionDepth =
    this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (recursionDepth) {
    cm.AddCacheEntry("CMAKE_MAXIMUM_RECURSION_DEPTH", recursionDepth,
                     "Maximum recursion depth", cmStateEnums::STRING);
  }
  // if cmake args were provided then pass them in
  if (cmakeArgs) {
    // FIXME: Workaround to ignore unused CLI variables in try-compile.
    //
    // Ideally we should use SetArgs to honor options like --warn-unused-vars.
    // However, there is a subtle problem when certain arguments are passed to
    // a macro wrapping around try_compile or try_run that does not escape
    // semicolons in its parameters but just passes ${ARGV} or ${ARGN}.  In
    // this case a list argument like "-DVAR=a;b" gets split into multiple
    // cmake arguments "-DVAR=a" and "b".  Currently SetCacheArgs ignores
    // argument "b" and uses just "-DVAR=a", leading to a subtle bug in that
    // the try_compile or try_run does not get the proper value of VAR.  If we
    // call SetArgs here then it would treat "b" as the source directory and
    // cause an error such as "The source directory .../CMakeFiles/CMakeTmp/b
    // does not exist", thus breaking the try_compile or try_run completely.
    //
    // Strictly speaking the bug is in the wrapper macro because the CMake
    // language has always flattened nested lists and the macro should escape
    // the semicolons in its arguments before forwarding them.  However, this
    // bug is so subtle that projects typically work anyway, usually because
    // the value VAR=a is sufficient for the try_compile or try_run to get the
    // correct result.  Calling SetArgs here would break such projects that
    // previously built.  Instead we work around the issue by never reporting
    // unused arguments and ignoring options such as --warn-unused-vars.
    cm.SetWarnUnusedCli(false);
    // cm.SetArgs(*cmakeArgs, true);

    cm.SetCacheArgs(*cmakeArgs);
  }
  // to save time we pass the EnableLanguage info directly
  gg->EnableLanguagesFromGenerator(this->GetGlobalGenerator(), this);
  if (this->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS")) {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE", "",
                     cmStateEnums::INTERNAL);
  } else {
    cm.AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE", "",
                     cmStateEnums::INTERNAL);
  }
  if (cm.Configure() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to configure test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  if (cm.Generate() != 0) {
    this->IssueMessage(MessageType::FATAL_ERROR,
                       "Failed to generate test project build system.");
    cmSystemTools::SetFatalErrorOccured();
    this->IsSourceFileTryCompile = false;
    return 1;
  }

  // finally call the generator to actually build the resulting project
  int ret = this->GetGlobalGenerator()->TryCompile(
    jobs, srcdir, bindir, projectName, targetName, fast, output, this);

  this->IsSourceFileTryCompile = false;
  return ret;
}